

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twtxt.c
# Opt level: O1

void listFollowing(char *followingJSON)

{
  cJSON *pcVar1;
  int iVar2;
  cJSON *array;
  char strvalue [400];
  char acStack_1b8 [408];
  
  array = cJSON_Parse(followingJSON);
  if ((array != (cJSON *)0x0) && (iVar2 = cJSON_GetArraySize(array), iVar2 != 0)) {
    wrkbuf = (char *)malloc(0x1000);
    memset(wrkbuf,0,0x1000);
    putchar(10);
    puts("You are following these users:");
    cJSONUtils_SortObject(array);
    for (pcVar1 = array->child; pcVar1 != (cJSON *)0x0; pcVar1 = pcVar1->next) {
      sprintf(acStack_1b8,"  @%-20s [ %s ]",pcVar1->string,pcVar1->valuestring);
      strncat(wrkbuf,acStack_1b8,8);
    }
    cJSON_Delete((cJSON *)0x0);
    cJSON_Delete(array);
    return;
  }
  puts("You are not following any users yet.\n");
  return;
}

Assistant:

void listFollowing(const char* followingJSON) {
    /* Puts the list of users you follow into <wrkbuf>. */
    cJSON *following = cJSON_Parse(followingJSON);

    if (following == NULL || cJSON_GetArraySize(following) == 0) {
        puts("You are not following any users yet.\n");
        return;
    }

    /* There actually are people you follow. */
    wrkbuf = (char *)malloc(4096); /* 4 KiB should be enough for now */
#ifdef _MSC_VER
    strcpy_s(wrkbuf, 4096, "");
#else
    strncpy(wrkbuf, "", 4096);
#endif

    puts("");
    puts("You are following these users:");

    /* Sort the list first: */
    cJSONUtils_SortObject(following);

    cJSON *followinglist = following->child;
    while (followinglist) {
        /* Traverse through the list. */
        char strvalue[400];

#ifdef _MSC_VER
        sprintf_s(strvalue, sizeof(strvalue), "  @%-20s [ %s ]\n", followinglist->string, followinglist->valuestring);
        strcat_s(wrkbuf, sizeof(strvalue), strvalue);
#else
        sprintf(strvalue, "  @%-20s [ %s ]", followinglist->string, followinglist->valuestring);
        strncat(wrkbuf, strvalue, sizeof(wrkbuf));
#endif
        followinglist = followinglist->next;
    }

    cJSON_Delete(followinglist);
    cJSON_Delete(following);
}